

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_test.cpp
# Opt level: O1

void __thiscall serial_test::create_serial(serial_test *this,char *name,char *extension)

{
  undefined8 *puVar1;
  int iVar2;
  AssertHelperData *pAVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  AssertHelper local_38;
  internal local_30 [8];
  undefined8 *local_28;
  
  pAVar3 = (AssertHelperData *)serial_create(name);
  local_40._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38.data_ = pAVar3;
  testing::internal::CmpHelperNE<plugin_type*,plugin_type*>
            (local_30,"(serial)__null","(serial)s",(plugin_type **)&local_40,
             (plugin_type **)&local_38);
  puVar1 = local_28;
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_28 == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*local_28;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x24,pcVar4);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
  }
  else {
    if (local_28 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_28 != local_28 + 2) {
        operator_delete((undefined8 *)*local_28);
      }
      operator_delete(puVar1);
    }
    local_40._M_head_impl = local_40._M_head_impl & 0xffffffff00000000;
    pcVar4 = (char *)serial_name(pAVar3);
    iVar2 = strcmp(name,pcVar4);
    local_38.data_._0_4_ = iVar2;
    testing::internal::CmpHelperEQ<int,int>
              (local_30,"(int)0","(int)strcmp(name, serial_name(s))",(int *)&local_40,
               (int *)&local_38);
    if (local_30[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      if (local_28 == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (char *)*local_28;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
                 ,0x26,pcVar4);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_40._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_40._M_head_impl + 8))();
      }
    }
    puVar1 = local_28;
    if (local_28 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_28 != local_28 + 2) {
        operator_delete((undefined8 *)*local_28);
      }
      operator_delete(puVar1);
    }
    local_40._M_head_impl = local_40._M_head_impl & 0xffffffff00000000;
    pcVar4 = (char *)serial_extension(pAVar3);
    iVar2 = strcmp(extension,pcVar4);
    local_38.data_._0_4_ = iVar2;
    testing::internal::CmpHelperEQ<int,int>
              (local_30,"(int)0","(int)strcmp(extension, serial_extension(s))",(int *)&local_40,
               (int *)&local_38);
    if (local_30[0] != (internal)0x0) goto LAB_0010caff;
    testing::Message::Message((Message *)&local_40);
    if (local_28 == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*local_28;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x28,pcVar4);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  if (local_40._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_40._M_head_impl + 8))();
  }
LAB_0010caff:
  if (local_28 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_28 != local_28 + 2) {
      operator_delete((undefined8 *)*local_28);
    }
    operator_delete(local_28);
  }
  return;
}

Assistant:

void create_serial(const char *name, const char *extension)
	{
		serial s = serial_create(name);

		ASSERT_NE((serial)NULL, (serial)s);

		EXPECT_EQ((int)0, (int)strcmp(name, serial_name(s)));

		EXPECT_EQ((int)0, (int)strcmp(extension, serial_extension(s)));
	}